

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenStringConcatSetRight(BinaryenExpressionRef expr,BinaryenExpressionRef rightExpr)

{
  if (expr->_id != StringConcatId) {
    __assert_fail("expression->is<StringConcat>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x123c,
                  "void BinaryenStringConcatSetRight(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (rightExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)rightExpr;
    return;
  }
  __assert_fail("rightExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x123d,
                "void BinaryenStringConcatSetRight(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringConcatSetRight(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef rightExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringConcat>());
  assert(rightExpr);
  static_cast<StringConcat*>(expression)->right = (Expression*)rightExpr;
}